

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateCopies
               (vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                *copies,ImageInfo *srcInfo,ImageInfo *dstInfo)

{
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  IVec3 *pIVar11;
  int local_2f4;
  int local_2dc;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  bool local_2a9;
  Copy local_2a8;
  undefined1 local_270 [8];
  IVec3 dstCopySize_2;
  IVec3 srcCopySize_2;
  IVec3 dstPos_2;
  IVec3 srcPos_2;
  Vector<int,_3> local_234;
  Vector<int,_3> local_228;
  Vector<int,_3> local_21c;
  undefined1 local_210 [8];
  IVec3 dstBlockPos_2;
  Vector<int,_3> local_1f8;
  Vector<int,_3> local_1ec;
  Vector<int,_3> local_1e0;
  undefined1 local_1d4 [8];
  IVec3 srcBlockPos_2;
  IVec3 copyBlockSize_2;
  undefined1 local_184 [8];
  IVec3 dstCopySize_1;
  IVec3 srcCopySize_1;
  IVec3 dstPos_1;
  IVec3 srcPos_1;
  IVec3 dstBlockPos_1;
  IVec3 srcBlockPos_1;
  IVec3 copyBlockSize_1;
  undefined1 local_f8 [8];
  IVec3 dstCopySize;
  IVec3 srcCopySize;
  IVec3 dstPos;
  IVec3 srcPos;
  IVec3 dstBlockPos;
  IVec3 srcBlockPos;
  IVec3 copyBlockSize;
  int copyBlockDepth;
  int copyBlockHeight;
  int copyBlockWidth;
  IVec3 maxCopyBlockSize;
  IVec3 dstCompleteBlockSize;
  IVec3 srcCompleteBlockSize;
  IVec3 dstSize;
  IVec3 srcSize;
  int dstLevel;
  int srcLevel;
  int levelNdx;
  int levels [3];
  IVec3 dstBlockPixelSize;
  IVec3 srcBlockPixelSize;
  bool dstIsCube;
  bool srcIsCube;
  bool dstIsTexture;
  bool srcIsTexture;
  deUint32 dstTarget;
  deUint32 srcTarget;
  ImageInfo *dstInfo_local;
  ImageInfo *srcInfo_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  *copies_local;
  
  dVar3 = ImageInfo::getTarget(srcInfo);
  dVar4 = ImageInfo::getTarget(dstInfo);
  dVar5 = ImageInfo::getTarget(srcInfo);
  bVar1 = isTextureTarget(dVar5);
  dVar5 = ImageInfo::getTarget(dstInfo);
  bVar2 = isTextureTarget(dVar5);
  dVar5 = ImageInfo::getFormat(srcInfo);
  getTexelBlockPixelSize((anon_unknown_0 *)(dstBlockPixelSize.m_data + 1),dVar5);
  dVar5 = ImageInfo::getFormat(dstInfo);
  getTexelBlockPixelSize((anon_unknown_0 *)(levels + 1),dVar5);
  _srcLevel = 0x100000000;
  levels[0] = -1;
  dstLevel = 0;
  while( true ) {
    local_2a9 = true;
    if (!bVar1) {
      local_2a9 = bVar2;
    }
    iVar6 = 1;
    if (local_2a9 != false) {
      iVar6 = 3;
    }
    if (iVar6 <= dstLevel) break;
    if (bVar1) {
      if ((&srcLevel)[dstLevel] < 0) {
        local_2b4 = getLastFullLevel(srcInfo);
      }
      else {
        local_2b4 = (&srcLevel)[dstLevel];
      }
      local_2b8 = local_2b4;
    }
    else {
      local_2b8 = 0;
    }
    if (bVar2) {
      if ((&srcLevel)[dstLevel] < 0) {
        local_2bc = getLastFullLevel(dstInfo);
      }
      else {
        local_2bc = (&srcLevel)[dstLevel];
      }
      local_2c0 = local_2bc;
    }
    else {
      local_2c0 = 0;
    }
    dVar5 = ImageInfo::getTarget(srcInfo);
    pIVar11 = ImageInfo::getSize(srcInfo);
    getLevelSize((anon_unknown_0 *)(dstSize.m_data + 1),dVar5,pIVar11,local_2b8);
    dVar5 = ImageInfo::getTarget(dstInfo);
    pIVar11 = ImageInfo::getSize(dstInfo);
    getLevelSize((anon_unknown_0 *)(srcCompleteBlockSize.m_data + 1),dVar5,pIVar11,local_2c0);
    iVar6 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(dstSize.m_data + 1));
    iVar7 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    iVar8 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(dstSize.m_data + 1));
    iVar9 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    if (dVar3 == 0x8513) {
      local_2dc = 6;
    }
    else {
      local_2dc = tcu::Vector<int,_3>::z((Vector<int,_3> *)(dstSize.m_data + 1));
      iVar10 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
      local_2dc = local_2dc / iVar10;
    }
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(dstCompleteBlockSize.m_data + 1),iVar6 / iVar7,iVar8 / iVar9,
               local_2dc);
    iVar6 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(srcCompleteBlockSize.m_data + 1));
    iVar7 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(levels + 1));
    iVar8 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(srcCompleteBlockSize.m_data + 1));
    iVar9 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(levels + 1));
    if (dVar4 == 0x8513) {
      local_2f4 = 6;
    }
    else {
      local_2f4 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(srcCompleteBlockSize.m_data + 1));
      iVar10 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(levels + 1));
      local_2f4 = local_2f4 / iVar10;
    }
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(maxCopyBlockSize.m_data + 1),iVar6 / iVar7,iVar8 / iVar9,local_2f4
              );
    tcu::min<int,3>((tcu *)&copyBlockHeight,(Vector<int,_3> *)(dstCompleteBlockSize.m_data + 1),
                    (Vector<int,_3> *)(maxCopyBlockSize.m_data + 1));
    iVar6 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&copyBlockHeight);
    iVar6 = de::max<int>((iVar6 / 4) * 2 + -1,1);
    iVar7 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&copyBlockHeight);
    iVar7 = de::max<int>((iVar7 / 4) * 2 + -1,1);
    iVar8 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&copyBlockHeight);
    iVar8 = de::max<int>((iVar8 / 4) * 2 + -1,1);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcBlockPos.m_data + 1),iVar6,iVar7,iVar8);
    tcu::operator-((tcu *)(dstBlockPos.m_data + 1),
                   (Vector<int,_3> *)(dstCompleteBlockSize.m_data + 1),
                   (Vector<int,_3> *)(srcBlockPos.m_data + 1));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcPos.m_data + 1),0,0,0);
    tcu::operator*((tcu *)(dstPos.m_data + 1),(Vector<int,_3> *)(dstBlockPos.m_data + 1),
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)(srcCopySize.m_data + 1),(Vector<int,_3> *)(srcPos.m_data + 1),
                   (Vector<int,_3> *)(levels + 1));
    tcu::operator*((tcu *)(dstCopySize.m_data + 1),(Vector<int,_3> *)(srcBlockPos.m_data + 1),
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)local_f8,(Vector<int,_3> *)(srcBlockPos.m_data + 1),
                   (Vector<int,_3> *)(levels + 1));
    Copy::Copy((Copy *)(copyBlockSize_1.m_data + 1),(IVec3 *)(dstPos.m_data + 1),local_2b8,
               (IVec3 *)(srcCopySize.m_data + 1),local_2c0,(IVec3 *)(dstCopySize.m_data + 1),
               (IVec3 *)local_f8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(copies,(value_type *)(copyBlockSize_1.m_data + 1));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcBlockPos_1.m_data + 1),iVar6,iVar7,iVar8);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(dstBlockPos_1.m_data + 1),0,0,0);
    tcu::operator-((tcu *)(srcPos_1.m_data + 1),(Vector<int,_3> *)(maxCopyBlockSize.m_data + 1),
                   (Vector<int,_3> *)(srcBlockPos_1.m_data + 1));
    tcu::operator*((tcu *)(dstPos_1.m_data + 1),(Vector<int,_3> *)(dstBlockPos_1.m_data + 1),
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)(srcCopySize_1.m_data + 1),(Vector<int,_3> *)(srcPos_1.m_data + 1),
                   (Vector<int,_3> *)(levels + 1));
    tcu::operator*((tcu *)(dstCopySize_1.m_data + 1),(Vector<int,_3> *)(srcBlockPos_1.m_data + 1),
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)local_184,(Vector<int,_3> *)(srcBlockPos_1.m_data + 1),
                   (Vector<int,_3> *)(levels + 1));
    Copy::Copy((Copy *)(copyBlockSize_2.m_data + 1),(IVec3 *)(dstPos_1.m_data + 1),local_2b8,
               (IVec3 *)(srcCopySize_1.m_data + 1),local_2c0,(IVec3 *)(dstCopySize_1.m_data + 1),
               (IVec3 *)local_184);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(copies,(value_type *)(copyBlockSize_2.m_data + 1));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcBlockPos_2.m_data + 1),iVar6,iVar7,iVar8);
    tcu::operator/((tcu *)&local_1f8,(Vector<int,_3> *)(dstCompleteBlockSize.m_data + 1),4);
    tcu::operator*((tcu *)&local_1ec,&local_1f8,4);
    tcu::operator-((tcu *)&local_1e0,&local_1ec,(Vector<int,_3> *)(srcBlockPos_2.m_data + 1));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(dstBlockPos_2.m_data + 1),0);
    tcu::max<int,3>((tcu *)local_1d4,&local_1e0,(Vector<int,_3> *)(dstBlockPos_2.m_data + 1));
    tcu::operator/((tcu *)&local_234,(Vector<int,_3> *)(maxCopyBlockSize.m_data + 1),4);
    tcu::operator*((tcu *)&local_228,&local_234,4);
    tcu::operator-((tcu *)&local_21c,&local_228,(Vector<int,_3> *)(srcBlockPos_2.m_data + 1));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcPos_2.m_data + 1),0);
    tcu::max<int,3>((tcu *)local_210,&local_21c,(Vector<int,_3> *)(srcPos_2.m_data + 1));
    tcu::operator*((tcu *)(dstPos_2.m_data + 1),(Vector<int,_3> *)local_1d4,
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)(srcCopySize_2.m_data + 1),(Vector<int,_3> *)local_210,
                   (Vector<int,_3> *)(levels + 1));
    tcu::operator*((tcu *)(dstCopySize_2.m_data + 1),(Vector<int,_3> *)(srcBlockPos_2.m_data + 1),
                   (Vector<int,_3> *)(dstBlockPixelSize.m_data + 1));
    tcu::operator*((tcu *)local_270,(Vector<int,_3> *)(srcBlockPos_2.m_data + 1),
                   (Vector<int,_3> *)(levels + 1));
    Copy::Copy(&local_2a8,(IVec3 *)(dstPos_2.m_data + 1),local_2b8,
               (IVec3 *)(srcCopySize_2.m_data + 1),local_2c0,(IVec3 *)(dstCopySize_2.m_data + 1),
               (IVec3 *)local_270);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(copies,&local_2a8);
    dstLevel = dstLevel + 1;
  }
  return;
}

Assistant:

void generateCopies (vector<Copy>& copies, const ImageInfo& srcInfo, const ImageInfo& dstInfo)
{
	const deUint32	srcTarget		= srcInfo.getTarget();
	const deUint32	dstTarget		= dstInfo.getTarget();

	const bool		srcIsTexture	= isTextureTarget(srcInfo.getTarget());
	const bool		dstIsTexture	= isTextureTarget(dstInfo.getTarget());

	const bool		srcIsCube		= srcTarget == GL_TEXTURE_CUBE_MAP;
	const bool		dstIsCube		= dstTarget == GL_TEXTURE_CUBE_MAP;

	const IVec3		srcBlockPixelSize		= getTexelBlockPixelSize(srcInfo.getFormat());
	const IVec3		dstBlockPixelSize		= getTexelBlockPixelSize(dstInfo.getFormat());

	const int levels[] =
	{
		0, 1, -1
	};

	for (int levelNdx = 0; levelNdx < (srcIsTexture || dstIsTexture ? DE_LENGTH_OF_ARRAY(levels) : 1); levelNdx++)
	{
		const int	srcLevel				= (srcIsTexture ? (levels[levelNdx] >= 0 ? levels[levelNdx] : getLastFullLevel(srcInfo)) : 0);
		const int	dstLevel				= (dstIsTexture ? (levels[levelNdx] >= 0 ? levels[levelNdx] : getLastFullLevel(dstInfo)) : 0);

		const IVec3	srcSize					= getLevelSize(srcInfo.getTarget(), srcInfo.getSize(), srcLevel);
		const IVec3	dstSize					= getLevelSize(dstInfo.getTarget(), dstInfo.getSize(), dstLevel);

		// \note These are rounded down
		const IVec3	srcCompleteBlockSize	= IVec3(srcSize.x() / srcBlockPixelSize.x(), srcSize.y() / srcBlockPixelSize.y(), (srcIsCube ? 6 : srcSize.z() / srcBlockPixelSize.z()));
		const IVec3	dstCompleteBlockSize	= IVec3(dstSize.x() / dstBlockPixelSize.x(), dstSize.y() / dstBlockPixelSize.y(), (dstIsCube ? 6 : dstSize.z() / dstBlockPixelSize.z()));

		const IVec3	maxCopyBlockSize		= tcu::min(srcCompleteBlockSize, dstCompleteBlockSize);

		// \note These are rounded down
		const int	copyBlockWidth			= de::max((2 * (maxCopyBlockSize.x() / 4)) - 1, 1);
		const int	copyBlockHeight			= de::max((2 * (maxCopyBlockSize.y() / 4)) - 1, 1);
		const int	copyBlockDepth			= de::max((2 * (maxCopyBlockSize.z() / 4)) - 1, 1);

		// Copy NPOT block to (0,0,0) from other corner on src
		{
			const IVec3	copyBlockSize	(copyBlockWidth, copyBlockHeight, copyBlockDepth);
			const IVec3	srcBlockPos		(srcCompleteBlockSize - copyBlockSize);
			const IVec3	dstBlockPos		(0, 0, 0);

			const IVec3	srcPos			(srcBlockPos * srcBlockPixelSize);
			const IVec3	dstPos			(dstBlockPos * dstBlockPixelSize);
			const IVec3 srcCopySize		(copyBlockSize * srcBlockPixelSize);
			const IVec3 dstCopySize		(copyBlockSize * dstBlockPixelSize);

			copies.push_back(Copy(srcPos, srcLevel, dstPos, dstLevel, srcCopySize, dstCopySize));
		}

		// Copy NPOT block from (0,0,0) to other corner on dst
		{
			const IVec3	copyBlockSize	(copyBlockWidth, copyBlockHeight, copyBlockDepth);
			const IVec3	srcBlockPos		(0, 0, 0);
			const IVec3	dstBlockPos		(dstCompleteBlockSize - copyBlockSize);

			const IVec3	srcPos			(srcBlockPos * srcBlockPixelSize);
			const IVec3	dstPos			(dstBlockPos * dstBlockPixelSize);
			const IVec3 srcCopySize		(copyBlockSize * srcBlockPixelSize);
			const IVec3 dstCopySize		(copyBlockSize * dstBlockPixelSize);

			copies.push_back(Copy(srcPos, srcLevel, dstPos, dstLevel, srcCopySize, dstCopySize));
		}

		// Copy NPOT block near the corner with high coordinates
		{
			const IVec3	copyBlockSize	(copyBlockWidth, copyBlockHeight, copyBlockDepth);
			const IVec3	srcBlockPos		(tcu::max((srcCompleteBlockSize / 4) * 4 - copyBlockSize, IVec3(0)));
			const IVec3	dstBlockPos		(tcu::max((dstCompleteBlockSize / 4) * 4 - copyBlockSize, IVec3(0)));

			const IVec3	srcPos			(srcBlockPos * srcBlockPixelSize);
			const IVec3	dstPos			(dstBlockPos * dstBlockPixelSize);
			const IVec3 srcCopySize		(copyBlockSize * srcBlockPixelSize);
			const IVec3 dstCopySize		(copyBlockSize * dstBlockPixelSize);

			copies.push_back(Copy(srcPos, srcLevel, dstPos, dstLevel, srcCopySize, dstCopySize));
		}
	}
}